

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O3

bool __thiscall
absl::cord_internal::CordzHandle::DiagnosticsHandleIsSafeToInspect
          (CordzHandle *this,CordzHandle *handle)

{
  CordzHandle *pCVar1;
  byte in_CL;
  byte bVar2;
  
  if (this->is_snapshot_ != true) {
LAB_0017ce0c:
    bVar2 = 0;
    goto LAB_0017ce6f;
  }
  if (handle == (CordzHandle *)0x0) {
    bVar2 = 1;
    goto LAB_0017ce6f;
  }
  if (handle->is_snapshot_ != false) goto LAB_0017ce0c;
  anon_unknown_0::GlobalQueue();
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  if (anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ == 0) {
LAB_0017ce59:
    DiagnosticsHandleIsSafeToInspect();
LAB_0017ce5e:
    bVar2 = in_CL ^ 1;
  }
  else {
    in_CL = false;
    pCVar1 = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
    do {
      if (pCVar1 == handle) goto LAB_0017ce5e;
      if (pCVar1 == this) {
        in_CL = true;
      }
      pCVar1 = pCVar1->dq_prev_;
    } while (pCVar1 != (CordzHandle *)0x0);
    bVar2 = 1;
    if (!(bool)in_CL) goto LAB_0017ce59;
  }
  Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
LAB_0017ce6f:
  return (bool)(bVar2 & 1);
}

Assistant:

bool CordzHandle::DiagnosticsHandleIsSafeToInspect(
    const CordzHandle* handle) const {
  if (!is_snapshot_) return false;
  if (handle == nullptr) return true;
  if (handle->is_snapshot_) return false;
  bool snapshot_found = false;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = global_queue.dq_tail; p; p = p->dq_prev_) {
    if (p == handle) return !snapshot_found;
    if (p == this) snapshot_found = true;
  }
  ABSL_ASSERT(snapshot_found);  // Assert that 'this' is in delete queue.
  return true;
}